

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8 *target)

{
  int size;
  uint8 *puVar1;
  uint8 *target_local;
  MessageLite *this_local;
  
  size = (*this->_vptr_MessageLite[10])();
  puVar1 = SerializeToArrayImpl(this,target,size);
  return puVar1;
}

Assistant:

uint8* MessageLite::SerializeWithCachedSizesToArray(uint8* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  return SerializeToArrayImpl(*this, target, GetCachedSize());
}